

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O3

void freeSignature2(signature2_t *sig,picnic_instance_t *params)

{
  proof2_t *ppVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  
  if (sig != (signature2_t *)0x0) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    uVar2 = params->num_rounds;
    if (uVar2 != 0) {
      lVar4 = 0x28;
      uVar3 = 0;
      do {
        ppVar1 = sig->proofs;
        if (ppVar1 != (proof2_t *)0x0) {
          free(*(void **)((long)ppVar1 + lVar4 + -0x28));
          free(*(void **)((long)ppVar1 + lVar4 + -0x10));
          free(*(void **)((long)ppVar1 + lVar4 + -8));
          free(*(void **)((long)ppVar1 + lVar4 + -0x18));
          free(*(void **)((long)&ppVar1->seedInfo + lVar4));
          uVar2 = params->num_rounds;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x38;
      } while (uVar3 < uVar2);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
    return;
  }
  return;
}

Assistant:

void freeSignature2(signature2_t* sig, const picnic_instance_t* params) {
  if (sig) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    for (size_t i = 0; i < params->num_rounds; i++) {
      freeProof2(&sig->proofs[i]);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
  }
}